

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_json.c
# Opt level: O0

void json_add_int(json_t *json,char *key,int64_t value)

{
  int iVar1;
  size_t len_00;
  size_t len;
  char buffer [512];
  int64_t value_local;
  char *key_local;
  json_t *json_local;
  
  json_check_comma(json);
  iVar1 = snprintf((char *)&len,0x200,"%ld");
  if (key != (char *)0x0) {
    len_00 = strlen(key);
    json_write_raw(json,key,len_00,true,true);
    json_write_raw(json,":",1,false,false);
  }
  json_write_raw(json,(char *)&len,(long)iVar1,false,key == (char *)0x0);
  return;
}

Assistant:

void json_add_int (json_t *json, const char *key, int64_t value) {
    json_check_comma(json);
    
    char buffer[512];
    size_t len = snprintf(buffer, sizeof(buffer), "%" PRId64, value);

    if (key) {
        json_write_raw (json, key, strlen(key), true, true);
        JSON_WRITE_COLUMN;
    }
    
    json_write_raw(json, buffer, len, false, (key == NULL));
}